

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
HasMember(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *this,Ch *name)

{
  ConstMemberIterator CVar1;
  ConstMemberIterator CVar2;
  
  CVar1 = FindMember(this,name);
  CVar2 = MemberEnd(this);
  return CVar1.ptr_ != CVar2.ptr_;
}

Assistant:

bool HasMember(const Ch* name) const { return FindMember(name) != MemberEnd(); }